

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VScaleAddMultiVectorArray_Serial
              (int nvec,int nsum,realtype *a,N_Vector *X,N_Vector **Y,N_Vector **Z)

{
  size_t __size;
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  N_Vector *Y_00;
  N_Vector *Z_00;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  iVar5 = -1;
  if (0 < nsum && 0 < nvec) {
    if (nvec == 1) {
      if (nsum != 1) {
        __size = (ulong)(uint)nsum * 8;
        Y_00 = (N_Vector *)malloc(__size);
        Z_00 = (N_Vector *)malloc(__size);
        uVar6 = 0;
        do {
          Y_00[uVar6] = *Y[uVar6];
          Z_00[uVar6] = *Z[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uint)nsum != uVar6);
        iVar5 = N_VScaleAddMulti_Serial(nsum,a,*X,Y_00,Z_00);
        free(Y_00);
        free(Z_00);
        return iVar5;
      }
      N_VLinearSum_Serial(*a,*X,1.0,**Y,**Z);
    }
    else {
      if (nsum == 1) {
        iVar5 = N_VLinearSumVectorArray_Serial(nvec,*a,X,1.0,*Y,*Z);
        return iVar5;
      }
      uVar1 = *(*X)->content;
      uVar6 = 0;
      if (Y == Z) {
        do {
          lVar2 = *(long *)((long)X[uVar6]->content + 8);
          uVar7 = 0;
          do {
            if (0 < (int)uVar1) {
              lVar3 = *(long *)((long)Y[uVar7][uVar6]->content + 8);
              uVar8 = 0;
              do {
                *(double *)(lVar3 + uVar8 * 8) =
                     a[uVar7] * *(double *)(lVar2 + uVar8 * 8) + *(double *)(lVar3 + uVar8 * 8);
                uVar8 = uVar8 + 1;
              } while (uVar1 != uVar8);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != (uint)nsum);
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)nvec);
      }
      else {
        do {
          lVar2 = *(long *)((long)X[uVar6]->content + 8);
          uVar7 = 0;
          do {
            if (0 < (int)uVar1) {
              lVar3 = *(long *)((long)Y[uVar7][uVar6]->content + 8);
              lVar4 = *(long *)((long)Z[uVar7][uVar6]->content + 8);
              uVar8 = 0;
              do {
                *(double *)(lVar4 + uVar8 * 8) =
                     a[uVar7] * *(double *)(lVar2 + uVar8 * 8) + *(double *)(lVar3 + uVar8 * 8);
                uVar8 = uVar8 + 1;
              } while (uVar1 != uVar8);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != (uint)nsum);
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)nvec);
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int N_VScaleAddMultiVectorArray_Serial(int nvec, int nsum, realtype* a,
                                        N_Vector* X, N_Vector** Y, N_Vector** Z)
{
  int          i, j;
  sunindextype k, N;
  realtype*    xd=NULL;
  realtype*    yd=NULL;
  realtype*    zd=NULL;

  int          retval;
  N_Vector*   YY;
  N_Vector*   ZZ;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);
  if (nsum < 1) return(-1);

  /* ---------------------------
   * Special cases for nvec == 1
   * --------------------------- */

  if (nvec == 1) {

    /* should have called N_VLinearSum */
    if (nsum == 1) {
      N_VLinearSum_Serial(a[0], X[0], ONE, Y[0][0], Z[0][0]);
      return(0);
    }

    /* should have called N_VScaleAddMulti */
    YY = (N_Vector*) malloc(nsum * sizeof(N_Vector));
    ZZ = (N_Vector*) malloc(nsum * sizeof(N_Vector));

    for (j=0; j<nsum; j++) {
      YY[j] = Y[j][0];
      ZZ[j] = Z[j][0];
    }

    retval = N_VScaleAddMulti_Serial(nsum, a, X[0], YY, ZZ);

    free(YY);
    free(ZZ);
    return(retval);
  }

  /* --------------------------
   * Special cases for nvec > 1
   * -------------------------- */

  /* should have called N_VLinearSumVectorArray */
  if (nsum == 1) {
    retval = N_VLinearSumVectorArray_Serial(nvec, a[0], X, ONE, Y[0], Z[0]);
    return(retval);
  }

  /* ----------------------------
   * Compute multiple linear sums
   * ---------------------------- */

  /* get vector length */
  N = NV_LENGTH_S(X[0]);

  /*
   * Y[i][j] += a[i] * x[j]
   */
  if (Y == Z) {
    for (i=0; i<nvec; i++) {
      xd = NV_DATA_S(X[i]);
      for (j=0; j<nsum; j++){
        yd = NV_DATA_S(Y[j][i]);
        for (k=0; k<N; k++) {
          yd[k] += a[j] * xd[k];
        }
      }
    }
    return(0);
  }

  /*
   * Z[i][j] = Y[i][j] + a[i] * x[j]
   */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    for (j=0; j<nsum; j++){
      yd = NV_DATA_S(Y[j][i]);
      zd = NV_DATA_S(Z[j][i]);
      for (k=0; k<N; k++) {
        zd[k] = a[j] * xd[k] + yd[k];
      }
    }
  }
  return(0);
}